

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition-graph.hxx
# Opt level: O3

void __thiscall
lineage::heuristics::PartitionGraph::
removeVanishedEdges<std::vector<unsigned_long,std::allocator<unsigned_long>>&>
          (PartitionGraph *this,vector<unsigned_long,_std::allocator<unsigned_long>_> *buffer)

{
  unsigned_long uVar1;
  size_t edge;
  pointer pEVar2;
  pointer puVar3;
  _Hash_node_base *p_Var4;
  _Hash_node_base *p_Var5;
  pointer pRVar6;
  _Hash_node_base *p_Var7;
  long lVar8;
  _Hash_node_base *p_Var9;
  ulong uVar10;
  ulong uVar11;
  pointer puVar12;
  pointer puVar13;
  _Hash_node_base *p_Var14;
  unsigned_long uVar15;
  unsigned_long *puVar16;
  difference_type __d;
  _Hash_node_base *p_Var17;
  pointer pAVar18;
  bool bVar19;
  _Hash_node_base *p_Var20;
  const_iterator __cbeg;
  pointer puVar21;
  pointer puVar22;
  
  puVar21 = (buffer->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start;
  puVar22 = (buffer->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  if (puVar21 != puVar22) {
    uVar11 = (long)puVar22 - (long)puVar21 >> 3;
    lVar8 = 0x3f;
    if (uVar11 != 0) {
      for (; uVar11 >> lVar8 == 0; lVar8 = lVar8 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (puVar21,puVar22,((uint)lVar8 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (puVar21,puVar22);
    puVar21 = (buffer->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
              super__Vector_impl_data._M_start;
    puVar22 = (buffer->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
              super__Vector_impl_data._M_finish;
  }
  if (puVar21 != puVar22) {
    puVar16 = puVar21 + 1;
    do {
      puVar12 = puVar16;
      if (puVar12 == puVar22) goto LAB_0013e305;
      puVar16 = puVar12 + 1;
    } while (puVar12[-1] != *puVar12);
    puVar13 = puVar12 + -1;
    uVar15 = puVar12[-1];
    for (; puVar16 != puVar22; puVar16 = puVar16 + 1) {
      uVar1 = *puVar16;
      if (uVar15 != uVar1) {
        puVar13[1] = uVar1;
        puVar13 = puVar13 + 1;
      }
      uVar15 = uVar1;
    }
    puVar13 = puVar13 + 1;
    if (puVar13 != puVar22) {
      (buffer->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_finish = puVar13;
      puVar22 = puVar13;
    }
  }
LAB_0013e305:
  if (puVar22 != puVar21) {
    do {
      edge = puVar22[-1];
      pEVar2 = (this->super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>).edges_.
               super__Vector_base<andres::graph::detail::Edge<true,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<true,_unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      puVar3 = (this->partitions_).
               super__Vector_base<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      p_Var14 = puVar3[pEVar2[edge].vertexIndices_[0]]._M_h._M_before_begin._M_nxt;
      if (p_Var14 == (_Hash_node_base *)0x0) {
LAB_0013e44c:
        removeEdge(this,edge);
        puVar21 = (buffer->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                  _M_impl.super__Vector_impl_data._M_start;
      }
      else {
        p_Var4 = puVar3[pEVar2[edge].vertexIndices_[1]]._M_h._M_before_begin._M_nxt;
        bVar19 = false;
LAB_0013e35e:
        do {
          if (p_Var4 != (_Hash_node_base *)0x0) {
            p_Var5 = p_Var14[1]._M_nxt;
            pRVar6 = (this->data_->problemGraph->graph_).vertices_.
                     super__Vector_base<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>,_std::allocator<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            p_Var20 = p_Var4;
            do {
              p_Var7 = p_Var20[1]._M_nxt;
              p_Var17 = p_Var7;
              p_Var9 = p_Var5;
              if ((ulong)((long)*(pointer *)((long)(pRVar6 + (long)p_Var5) + 8) -
                         *(long *)&pRVar6[(long)p_Var5].vector_) <=
                  (ulong)((long)*(pointer *)((long)(pRVar6 + (long)p_Var7) + 8) -
                         *(long *)&pRVar6[(long)p_Var7].vector_)) {
                p_Var17 = p_Var5;
                p_Var9 = p_Var7;
              }
              pAVar18 = *(pointer *)&pRVar6[(long)p_Var17].vector_;
              uVar11 = (long)*(pointer *)((long)(pRVar6 + (long)p_Var17) + 8) - (long)pAVar18 >> 4;
              while (uVar10 = uVar11, 0 < (long)uVar10) {
                uVar11 = uVar10 >> 1;
                if (*(_Hash_node_base **)(pAVar18 + uVar11) < p_Var9) {
                  pAVar18 = pAVar18 + uVar11 + 1;
                  uVar11 = ~uVar11 + uVar10;
                }
              }
              if ((*(pointer *)((long)(pRVar6 + (long)p_Var17) + 8) != pAVar18) &&
                 ((_Hash_node_base *)pAVar18->vertex_ == p_Var9)) {
                p_Var14 = p_Var14->_M_nxt;
                bVar19 = true;
                if (p_Var14 == (_Hash_node_base *)0x0) goto LAB_0013e457;
                goto LAB_0013e35e;
              }
              p_Var20 = p_Var20->_M_nxt;
            } while (p_Var20 != (_Hash_node_base *)0x0);
          }
          p_Var14 = p_Var14->_M_nxt;
        } while (p_Var14 != (_Hash_node_base *)0x0);
        if (!bVar19) goto LAB_0013e44c;
      }
LAB_0013e457:
      puVar22 = puVar22 + -1;
    } while (puVar22 != puVar21);
  }
  return;
}

Assistant:

void removeVanishedEdges(T&& buffer)
    {
        // Remove duplicates.
        // The second removal would remove an arbitrary other edge!
        std::sort(std::begin(buffer), std::end(buffer));
        auto last = std::unique(std::begin(buffer), std::end(buffer));
        buffer.erase(last, buffer.end());

        for (auto it = buffer.crbegin(); it != buffer.crend(); ++it) {

            bool exists = false;
            for (const auto& a : partitions_[this->vertexOfEdge(*it, 0)]) {
                for (const auto& b : partitions_[this->vertexOfEdge(*it, 1)]) {
                    if (this->data_.problemGraph.graph().findEdge(a, b).first) {
                        exists = true;
                        break;
                    }
                }
            }

            if (!exists) {
                removeEdge(*it);
            }
        }
    }